

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::anon_unknown_0::AdvancedResourcesMax::RunIteration(AdvancedResourcesMax *this,GLuint index)

{
  GLuint GVar1;
  GLint GVar2;
  value_type vVar3;
  size_type sVar4;
  reference pvVar5;
  CallLogWrapper *pCVar6;
  uint local_78;
  byte local_71;
  GLuint data_6;
  bool result;
  GLuint i_5;
  allocator<unsigned_int> local_59;
  undefined1 local_58 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> data_5;
  uint local_38;
  GLuint data_4;
  GLuint i_4;
  GLuint data_3;
  GLuint i_3;
  GLuint data_2;
  GLuint i_2;
  GLuint data_1;
  GLuint i_1;
  GLuint data;
  GLuint i;
  GLuint index_local;
  AdvancedResourcesMax *this_local;
  
  data = index;
  _i = this;
  for (i_1 = 0; i_1 < 8; i_1 = i_1 + 1) {
    data_1 = i_1 + 1;
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,i_1,this->m_storage_buffer[i_1]);
    glu::CallLogWrapper::glBufferData
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,4,&data_1,0x88e4);
  }
  for (i_2 = 0; i_2 < 0xc; i_2 = i_2 + 1) {
    data_2 = i_2 + 1;
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8a11,i_2,this->m_uniform_buffer[i_2]);
    glu::CallLogWrapper::glBufferData
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8a11,4,&data_2,0x88e4);
  }
  for (i_3 = 0; i_3 < 8; i_3 = i_3 + 1) {
    data_3 = i_3 + 1;
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x92c0,i_3,this->m_atomic_buffer[i_3]);
    glu::CallLogWrapper::glBufferData
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x92c0,4,&data_3,0x88e4);
  }
  for (i_4 = 0; i_4 < 0x10; i_4 = i_4 + 1) {
    data_4 = i_4 + 1;
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c2a,this->m_texture_buffer[i_4]);
    glu::CallLogWrapper::glBufferData
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c2a,4,&data_4,0x88e9);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c2a,0);
    glu::CallLogWrapper::glActiveTexture
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,i_4 + 0x84c0);
    glu::CallLogWrapper::glBindTexture
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c2a,this->m_texture[i_4]);
    glu::CallLogWrapper::glTexBuffer
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c2a,0x8236,this->m_texture_buffer[i_4]);
  }
  for (local_38 = 0; local_38 < 8; local_38 = local_38 + 1) {
    data_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = local_38 + 1;
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c2a,this->m_image_buffer[local_38]);
    glu::CallLogWrapper::glBufferData
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c2a,4,
               (void *)((long)&data_5.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage + 4),0x88ea);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c2a,0);
    glu::CallLogWrapper::glBindTexture
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c2a,this->m_image[local_38]);
    glu::CallLogWrapper::glTexBuffer
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c2a,0x8236,this->m_image_buffer[local_38]);
    glu::CallLogWrapper::glBindTexture
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c2a,0);
    glu::CallLogWrapper::glBindImageTexture
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,local_38,this->m_image[local_38],0,'\0',0,35000,0x8236);
  }
  pCVar6 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glUseProgram(pCVar6,this->m_program);
  GVar2 = glu::CallLogWrapper::glGetUniformLocation(pCVar6,this->m_program,"g_index");
  glu::CallLogWrapper::glUniform1ui(pCVar6,GVar2,data);
  std::allocator<unsigned_int>::allocator(&local_59);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,0x1e0,&local_59);
  std::allocator<unsigned_int>::~allocator(&local_59);
  data_6 = 0;
  while( true ) {
    GVar1 = data_6;
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
    if ((uint)sVar4 <= GVar1) break;
    vVar3 = data_6 + 1;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,
                        (ulong)data_6);
    *pvVar5 = vVar3;
    data_6 = data_6 + 1;
  }
  pCVar6 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  GVar2 = glu::CallLogWrapper::glGetUniformLocation(pCVar6,this->m_program,"g_uniform_def");
  sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
  pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,0);
  glu::CallLogWrapper::glUniform1uiv(pCVar6,GVar2,(GLsizei)sVar4,pvVar5);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
  glu::CallLogWrapper::glDispatchCompute
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,1,1,1);
  glu::CallLogWrapper::glMemoryBarrier
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x200);
  local_71 = 1;
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x90d2,this->m_storage_buffer[data]);
  glu::CallLogWrapper::glGetBufferSubData
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x90d2,0,4,&local_78);
  if (local_78 != (data + 1) * 6) {
    anon_unknown_0::Output("Data is %d should be %d.\n",(ulong)local_78,(ulong)((data + 1) * 6));
    local_71 = 0;
  }
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x90d2,0);
  return (bool)(local_71 & 1);
}

Assistant:

bool RunIteration(GLuint index)
	{
		for (GLuint i = 0; i < 8; ++i)
		{
			const GLuint data = i + 1;
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, i, m_storage_buffer[i]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), &data, GL_STATIC_DRAW);
		}
		for (GLuint i = 0; i < 12; ++i)
		{
			const GLuint data = i + 1;
			glBindBufferBase(GL_UNIFORM_BUFFER, i, m_uniform_buffer[i]);
			glBufferData(GL_UNIFORM_BUFFER, sizeof(data), &data, GL_STATIC_DRAW);
		}
		for (GLuint i = 0; i < 8; ++i)
		{
			const GLuint data = i + 1;
			glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, i, m_atomic_buffer[i]);
			glBufferData(GL_ATOMIC_COUNTER_BUFFER, sizeof(data), &data, GL_STATIC_DRAW);
		}
		for (GLuint i = 0; i < 16; ++i)
		{
			const GLuint data = i + 1;
			glBindBuffer(GL_TEXTURE_BUFFER, m_texture_buffer[i]);
			glBufferData(GL_TEXTURE_BUFFER, sizeof(data), &data, GL_DYNAMIC_READ);
			glBindBuffer(GL_TEXTURE_BUFFER, 0);

			glActiveTexture(GL_TEXTURE0 + i);
			glBindTexture(GL_TEXTURE_BUFFER, m_texture[i]);
			glTexBuffer(GL_TEXTURE_BUFFER, GL_R32UI, m_texture_buffer[i]);
		}
		for (GLuint i = 0; i < 8; ++i)
		{
			const GLuint data = i + 1;
			glBindBuffer(GL_TEXTURE_BUFFER, m_image_buffer[i]);
			glBufferData(GL_TEXTURE_BUFFER, sizeof(data), &data, GL_DYNAMIC_COPY);
			glBindBuffer(GL_TEXTURE_BUFFER, 0);

			glBindTexture(GL_TEXTURE_BUFFER, m_image[i]);
			glTexBuffer(GL_TEXTURE_BUFFER, GL_R32UI, m_image_buffer[i]);
			glBindTexture(GL_TEXTURE_BUFFER, 0);

			glBindImageTexture(i, m_image[i], 0, GL_FALSE, 0, GL_READ_ONLY, GL_R32UI);
		}

		glUseProgram(m_program);
		glUniform1ui(glGetUniformLocation(m_program, "g_index"), index);
		/* uniform array */
		{
			std::vector<GLuint> data(480);
			for (GLuint i = 0; i < static_cast<GLuint>(data.size()); ++i)
				data[i]   = i + 1;
			glUniform1uiv(glGetUniformLocation(m_program, "g_uniform_def"), static_cast<GLsizei>(data.size()),
						  &data[0]);
		}
		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		bool result = true;
		/* validate buffer */
		{
			GLuint data;
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[index]);
			glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(data), &data);

			if (data != (index + 1) * 6)
			{
				Output("Data is %d should be %d.\n", data, (index + 1) * 6);
				result = false;
			}
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
		}
		return result;
	}